

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O2

void SDT::ERROR(int line,string *sgn)

{
  string o;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  stringstream local_198 [16];
  ostream local_188 [8];
  string local_180 [368];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::__cxx11::string::string((string *)&local_218,"",(allocator *)&local_1f8);
  std::__cxx11::stringbuf::str(local_180);
  std::__cxx11::string::~string((string *)&local_218);
  std::ostream::operator<<(local_188,line);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)local_198,(string *)&local_218);
  std::operator+(&local_1d8,"Error at Line ",&local_218);
  std::operator+(&local_1b8,&local_1d8,": ");
  std::operator+(&local_1f8,&local_1b8,sgn);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&errVec_abi_cxx11_
             ,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void ERROR(int line,string sgn){
        stringstream ss;
        ss.str("");
        ss << line;
        string o;
        ss >> o;
        errVec.push_back("Error at Line "+ o +": " + sgn);
    }